

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

void __thiscall ImGuiInputTextState::ImGuiInputTextState(ImGuiInputTextState *this)

{
  void *in_RDI;
  
  ImVector<unsigned_short>::ImVector((ImVector<unsigned_short> *)((long)in_RDI + 0x10));
  ImVector<char>::ImVector((ImVector<char> *)((long)in_RDI + 0x20));
  ImVector<char>::ImVector((ImVector<char> *)((long)in_RDI + 0x30));
  memset(in_RDI,0,0xe90);
  return;
}

Assistant:

ImGuiInputTextState()                   { memset(this, 0, sizeof(*this)); }